

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEdit.cpp
# Opt level: O0

void __thiscall GraphEdit::paintEvent(GraphEdit *this,QPaintEvent *evt)

{
  bool bVar1;
  DataType input;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Int IVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  QPoint *pQVar10;
  QRect *this_00;
  QPaintDevice *local_130;
  int ypos_3;
  int iStack_118;
  DataType sample;
  int i_2;
  int xpos_1;
  int count_1;
  int local_108;
  int local_104;
  int top_1;
  int skip;
  int ypos_2;
  int top;
  int ypos_1;
  int h;
  int i_1;
  int xpos;
  int count;
  int local_dc;
  int local_d8;
  int ypos;
  int i;
  BarPlotter plotter;
  int viewportWidth;
  int axis;
  int plotBottom;
  int plotTop;
  Int local_94;
  QString local_90;
  Int local_74;
  QWidget local_70 [8];
  QFontMetrics metrics;
  int local_60;
  int value;
  int viewportMax;
  int viewportMin;
  QScrollBar *vscroll;
  QScrollBar *hscroll;
  QRect local_38;
  QPainter local_28 [8];
  QPainter painter;
  QWidget *_viewport;
  QPaintEvent *evt_local;
  GraphEdit *this_local;
  
  _painter = (QWidget *)QAbstractScrollArea::viewport();
  local_130 = (QPaintDevice *)0x0;
  if (_painter != (QWidget *)0x0) {
    local_130 = (QPaintDevice *)(_painter + 0x10);
  }
  QPainter::QPainter(local_28,local_130);
  local_38 = QWidget::rect(_painter);
  QPainter::fillRect((QRect *)local_28,(QColor *)&local_38);
  QAbstractScrollArea::horizontalScrollBar();
  QAbstractScrollArea::verticalScrollBar();
  iVar3 = QAbstractSlider::minimum();
  iVar4 = QAbstractSlider::maximum();
  if (iVar3 == iVar4) {
    value = this->mMinValue;
    local_60 = this->mMaxValue;
  }
  else {
    iVar3 = QAbstractSlider::maximum();
    iVar4 = QAbstractSlider::value();
    iVar5 = QAbstractSlider::minimum();
    value = iVar3 + (iVar5 - iVar4);
    local_60 = QAbstractSlider::pageStep();
    local_60 = value + local_60;
  }
  QWidget::fontMetrics(local_70);
  QPainter::setPen((QColor *)local_28);
  iVar4 = QRect::top(&this->mPlotRect);
  iVar3 = this->mYAxisWidth;
  iVar5 = QFontMetrics::height();
  local_74 = (Int)Qt::operator|(AlignRight,AlignTop);
  IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_74);
  QString::number((int)&local_90,local_60);
  QPainter::drawText(local_28,8,iVar4,iVar3,iVar5,IVar6,&local_90,(QRect *)0x0);
  QString::~QString(&local_90);
  iVar4 = QWidget::height(_painter);
  iVar5 = QFontMetrics::height();
  iVar3 = this->mYAxisWidth;
  iVar7 = QFontMetrics::height();
  local_94 = (Int)Qt::operator|(AlignRight,AlignBottom);
  IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_94);
  QString::number((int)&plotBottom,value);
  QPainter::drawText(local_28,8,(iVar4 + -8) - iVar5,iVar3,iVar7,IVar6,(QString *)&plotBottom,
                     (QRect *)0x0);
  QString::~QString((QString *)&plotBottom);
  QPainter::setPen((QColor *)local_28);
  this_00 = &this->mPlotRect;
  iVar3 = QRect::top(this_00);
  iVar3 = iVar3 + -1;
  iVar4 = QRect::bottom(this_00);
  iVar5 = QRect::left(this_00);
  plotter.mXAxis = iVar5 + -1;
  plotter.mBottom = QWidget::width(_painter);
  QPainter::drawLine(local_28,plotter.mXAxis,iVar3,plotter.mXAxis,iVar4);
  QPainter::drawLine(local_28,plotter.mXAxis + 1,iVar3,plotter.mBottom,iVar3);
  QPainter::drawLine(local_28,plotter.mXAxis + 1,iVar4,plotter.mBottom,iVar4);
  if ((this->mBarMode & 1U) == 0) {
    iVar3 = QRect::bottom(&this->mPlotRect);
    ypos_2 = iVar3 - this->mCellHeight;
    skip = QRect::top(&this->mPlotRect);
    for (; skip < ypos_2; ypos_2 = ypos_2 - this->mCellHeight) {
      iVar3 = QRect::left(&this->mPlotRect);
      QPainter::drawLine(local_28,iVar3,ypos_2,plotter.mBottom,ypos_2);
    }
    if (this->mAlternateInterval != 0) {
      iVar3 = QRect::bottom(&this->mPlotRect);
      iVar4 = GraphEditTU::mod(value,this->mAlternateInterval);
      top_1 = iVar3 - iVar4 * this->mCellHeight;
      local_104 = this->mAlternateInterval * this->mCellHeight;
      local_108 = QRect::top(&this->mPlotRect);
      for (; local_108 < top_1; top_1 = top_1 - local_104) {
        iVar3 = QRect::left(&this->mPlotRect);
        QPainter::fillRect(local_28,iVar3,(top_1 - this->mCellHeight) + 1,plotter.mBottom,
                           this->mCellHeight + -1,&this->mAlternateColor);
      }
    }
    iVar3 = QRect::x(&this->mPlotRect);
    iVar4 = QRect::bottom(&this->mPlotRect);
    QPoint::QPoint((QPoint *)&xpos_1,iVar3,iVar4 + value * this->mCellHeight);
    QPainter::translate(local_28,(QPoint *)&xpos_1);
    QPainter::scale(1.0,-1.0);
    QPainter::setPen((QColor *)local_28);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this->mMouseOver);
    if (bVar1) {
      pQVar10 = std::optional<QPoint>::operator->(&this->mMouseOver);
      iVar4 = QPoint::x(pQVar10);
      iVar3 = this->mCellWidth;
      pQVar10 = std::optional<QPoint>::operator->(&this->mMouseOver);
      iVar5 = QPoint::y(pQVar10);
      QPainter::drawRect(local_28,iVar4 * iVar3,(iVar5 + value) * this->mCellHeight,this->mCellWidth
                         ,this->mCellHeight);
    }
    iVar3 = (**(code **)(*(long *)this->mModel + 0x60))();
    iStack_118 = 1;
    ypos_3 = QAbstractSlider::value();
    for (; ypos_3 < iVar3; ypos_3 = ypos_3 + 1) {
      cVar2 = (**(code **)(*(long *)this->mModel + 0x68))(this->mModel,ypos_3);
      if ((value <= cVar2) && (cVar2 <= local_60)) {
        QPainter::fillRect(local_28,iStack_118,(int)cVar2 * this->mCellHeight,this->mCellWidth + -1,
                           this->mCellHeight + -1,&this->mSampleColor);
      }
      iStack_118 = this->mCellWidth + iStack_118;
    }
  }
  else {
    GraphEditTU::BarPlotter::BarPlotter
              ((BarPlotter *)&ypos,&this->mPlotRect,this->mMinValue,this->mMaxValue);
    if ((this->mLines & 1U) != 0) {
      local_d8 = this->mMinValue;
      while (local_d8 = local_d8 + 1, local_d8 < this->mMaxValue) {
        local_dc = GraphEditTU::BarPlotter::plot((BarPlotter *)&ypos,(DataType)local_d8);
        iVar3 = QRect::left(&this->mPlotRect);
        QPainter::drawLine(local_28,iVar3,local_dc,plotter.mBottom,local_dc);
      }
    }
    if (this->mMinValue != 0) {
      iVar4 = QRect::left(&this->mPlotRect);
      iVar5 = GraphEditTU::BarPlotter::xaxis((BarPlotter *)&ypos);
      iVar3 = plotter.mBottom;
      iVar7 = GraphEditTU::BarPlotter::xaxis((BarPlotter *)&ypos);
      QPainter::drawLine(local_28,iVar4,iVar5,iVar3,iVar7);
    }
    iVar3 = QRect::x(&this->mPlotRect);
    QPoint::QPoint((QPoint *)&xpos,iVar3,0);
    QPainter::translate(local_28,(QPoint *)&xpos);
    QPainter::setPen((QColor *)local_28);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this->mMouseOver);
    if (bVar1) {
      pQVar10 = std::optional<QPoint>::operator->(&this->mMouseOver);
      iVar5 = QPoint::x(pQVar10);
      iVar3 = this->mCellWidth;
      iVar7 = GraphEditTU::BarPlotter::xaxis((BarPlotter *)&ypos);
      iVar4 = this->mCellWidth;
      pQVar10 = std::optional<QPoint>::operator->(&this->mMouseOver);
      iVar8 = QPoint::y(pQVar10);
      iVar8 = GraphEditTU::BarPlotter::plot((BarPlotter *)&ypos,(DataType)iVar8);
      iVar9 = GraphEditTU::BarPlotter::xaxis((BarPlotter *)&ypos);
      QPainter::drawRect(local_28,iVar5 * iVar3,iVar7,iVar4,iVar8 - iVar9);
    }
    i_1 = (**(code **)(*(long *)this->mModel + 0x60))();
    h = 1;
    ypos_1 = QAbstractSlider::value();
    for (; ypos_1 < i_1; ypos_1 = ypos_1 + 1) {
      input = (**(code **)(*(long *)this->mModel + 0x68))(this->mModel,ypos_1);
      iVar4 = GraphEditTU::BarPlotter::plot((BarPlotter *)&ypos,input);
      iVar5 = GraphEditTU::BarPlotter::xaxis((BarPlotter *)&ypos);
      iVar3 = h;
      top = iVar4 - iVar5;
      if (top == 0) {
        top = 1;
      }
      iVar4 = GraphEditTU::BarPlotter::xaxis((BarPlotter *)&ypos);
      QPainter::fillRect(local_28,iVar3,iVar4,this->mCellWidth + -1,top,&this->mSampleColor);
      h = this->mCellWidth + h;
    }
  }
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_70);
  QPainter::~QPainter(local_28);
  return;
}

Assistant:

void GraphEdit::paintEvent(QPaintEvent *evt) {
    Q_UNUSED(evt)

    // paint on the viewport widget
    auto _viewport = viewport();
    QPainter painter(_viewport);

    // doing this manually instead of using auto-fill background because changing the
    // background role color in QPalette has no effect (tried both this widgets and the viewport widgets palette)
    painter.fillRect(_viewport->rect(), mBackgroundColor);

    auto hscroll = horizontalScrollBar();
    auto vscroll = verticalScrollBar();
    
    int viewportMin;
    int viewportMax;
    if (vscroll->minimum() == vscroll->maximum()) {
        viewportMin = mMinValue;
        viewportMax = mMaxValue;
    } else {
        auto value = vscroll->maximum() - (vscroll->value() - vscroll->minimum());
        viewportMin = value;
        viewportMax = value + vscroll->pageStep();
    }

    auto metrics = fontMetrics();

    // viewport minimum/maximum or just minimum/maximum
    painter.setPen(mSampleColor);
    painter.drawText(TU::PADDING_X, mPlotRect.top(), mYAxisWidth, metrics.height(), Qt::AlignRight | Qt::AlignTop, QString::number(viewportMax));
    painter.drawText(TU::PADDING_X, _viewport->height() - TU::PADDING_Y - metrics.height(), mYAxisWidth, metrics.height(), Qt::AlignRight | Qt::AlignBottom, QString::number(viewportMin));


    // Grid lines
    painter.setPen(mLineColor);
    auto const plotTop = mPlotRect.top() - 1;
    auto const plotBottom = mPlotRect.bottom();
    auto const axis = mPlotRect.left() - 1;
    auto const viewportWidth = _viewport->width();
    painter.drawLine(axis, plotTop, axis, plotBottom);
    painter.drawLine(axis + 1, plotTop, viewportWidth, plotTop);
    painter.drawLine(axis + 1, plotBottom, viewportWidth, plotBottom);

    if (mBarMode) {
        TU::BarPlotter plotter(mPlotRect, mMinValue, mMaxValue);
        if (mLines) {
            for (int i = mMinValue + 1; i < mMaxValue; ++i) {
                auto ypos = plotter.plot((GraphModel::DataType)i);
                painter.drawLine(mPlotRect.left(), ypos, viewportWidth, ypos);
            }
        }

        // xaxis (only drawn if the minimum value isn't 0, since then it is the bottom line of the plot)
        if (mMinValue) {
            painter.drawLine(mPlotRect.left(), plotter.xaxis(), viewportWidth, plotter.xaxis());
        }

        // mouse hover
        painter.translate(QPoint(mPlotRect.x(), 0));
        painter.setPen(mSampleColor);
        if (mMouseOver) {
            painter.drawRect(
                mMouseOver->x() * mCellWidth,
                plotter.xaxis(), 
                mCellWidth, 
                plotter.plot((GraphModel::DataType)mMouseOver->y()) - plotter.xaxis()
            );
        }

        // bars
        auto count = mModel.count();
        int xpos = 1;
        for (auto i = hscroll->value(); i < count; ++i, xpos += mCellWidth) {
            auto h = plotter.plot(mModel.dataAt(i)) - plotter.xaxis();
            if (h == 0) {
                h = 1;
            }
            painter.fillRect(xpos, plotter.xaxis(), mCellWidth - 1, h, mSampleColor);
        }

    } else {
        // always draw lines for sample view
        {
            int ypos = mPlotRect.bottom() - mCellHeight;
            for (int const top = mPlotRect.top(); ypos > top; ypos -= mCellHeight) {
                painter.drawLine(mPlotRect.left(), ypos, viewportWidth, ypos);
            }
        }

        if (mAlternateInterval) {
            int ypos = mPlotRect.bottom() - TU::mod(viewportMin, mAlternateInterval) * mCellHeight;
            int skip = mAlternateInterval * mCellHeight;
            for (int const top = mPlotRect.top(); ypos > top; ypos -= skip) {
                painter.fillRect(mPlotRect.left(), ypos - mCellHeight + 1, viewportWidth, mCellHeight - 1, mAlternateColor);
            }

        }

        painter.translate(QPoint(mPlotRect.x(), mPlotRect.bottom() + viewportMin * mCellHeight));
        painter.scale(1.0, -1.0);
        painter.setPen(mSampleColor);
        
        if (mMouseOver) {
            painter.drawRect(
                mMouseOver->x() * mCellWidth,
                (mMouseOver->y() + viewportMin) * mCellHeight, 
                mCellWidth, 
                mCellHeight
            );
        }

        auto count = mModel.count();
        int xpos = 1;
        for (int i = hscroll->value(); i < count; ++i, xpos += mCellWidth) {
            auto sample = mModel.dataAt(i);
            if (sample < viewportMin || sample > viewportMax) {
                continue;
            }
            auto ypos = sample * mCellHeight;
            painter.fillRect(xpos, ypos, mCellWidth - 1, mCellHeight - 1, mSampleColor);
        }
    }

}